

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

int __thiscall
particleSamples::read_in_particle_samples_UrQMD_3p3_mixed_event(particleSamples *this)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  void *pvVar3;
  istream *piVar4;
  string *type;
  istream *piVar5;
  long in_RDI;
  particle_info temp_particle_info;
  stringstream temp2;
  int ipart;
  stringstream temp1;
  int i;
  int num_particles;
  double temp_mass;
  int urqmd_charge;
  int urqmd_iso3;
  int urqmd_pid;
  int ievent;
  int parent_proc_type;
  double dummy;
  int n_particle;
  string temp_string;
  char (*in_stack_fffffffffffff988) [22];
  pretty_ostream *in_stack_fffffffffffff990;
  value_type *in_stack_fffffffffffff998;
  vector<particle_info,_std::allocator<particle_info>_> *in_stack_fffffffffffff9a0;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *in_stack_fffffffffffff9a8;
  allocator *paVar6;
  particleSamples *in_stack_fffffffffffff9b0;
  pretty_ostream *in_stack_fffffffffffffa28;
  particleSamples *in_stack_fffffffffffffa30;
  undefined1 local_4a9 [40];
  allocator local_481;
  string local_480 [39];
  allocator local_459;
  string local_458 [39];
  allocator local_431;
  string local_430 [32];
  int local_410;
  double local_408;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  double local_3e0;
  double local_3d8;
  double local_3d0;
  double local_3c8;
  double local_3c0 [5];
  stringstream local_398 [396];
  int local_20c;
  stringstream local_208 [396];
  int local_7c;
  void *local_78;
  int local_5c;
  double local_58;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  double local_38;
  int local_2c;
  string local_28 [40];
  
  clear_out_previous_record(in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
  std::__cxx11::string::string(local_28);
  local_40 = 0;
  local_5c = 0;
  while (local_5c < *(int *)(in_RDI + 0x5f0)) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)(in_RDI + 0x3d0),local_28);
    bVar1 = std::ios::eof();
    if ((bVar1 & 1) != 0) break;
    pvVar3 = operator_new(0x18);
    std::vector<particle_info,_std::allocator<particle_info>_>::vector
              ((vector<particle_info,_std::allocator<particle_info>_> *)0x14ccd3);
    local_78 = pvVar3;
    std::
    vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
    ::push_back((vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                 *)in_stack_fffffffffffff990,(value_type *)in_stack_fffffffffffff988);
    for (local_7c = 0; local_7c < 0xd; local_7c = local_7c + 1) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)(in_RDI + 0x3d0),local_28);
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)(in_RDI + 0x3d0),local_28);
    _Var2 = std::operator|(_S_out,_S_in);
    std::__cxx11::stringstream::stringstream(local_208,local_28,_Var2);
    std::istream::operator>>((istream *)local_208,&local_2c);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)(in_RDI + 0x3d0),local_28);
    for (local_20c = 0; local_20c < local_2c; local_20c = local_20c + 1) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)(in_RDI + 0x3d0),local_28);
      _Var2 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_398,local_28,_Var2);
      piVar4 = (istream *)std::istream::operator>>((istream *)local_398,&local_38);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_38);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_38);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_38);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_38);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_38);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_38);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_38);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_58);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_44);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_48);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_4c);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_38);
      piVar4 = (istream *)std::istream::operator>>(piVar4,&local_38);
      std::istream::operator>>(piVar4,&local_3c);
      piVar4 = (istream *)std::istream::operator>>((istream *)local_398,local_3c0);
      type = (string *)std::istream::operator>>(piVar4,&local_3d8);
      piVar5 = (istream *)std::istream::operator>>((istream *)type,&local_3d0);
      piVar5 = (istream *)std::istream::operator>>(piVar5,&local_3c8);
      piVar5 = (istream *)std::istream::operator>>(piVar5,&local_3e0);
      piVar5 = (istream *)std::istream::operator>>(piVar5,&local_3f8);
      piVar5 = (istream *)std::istream::operator>>(piVar5,&local_3f0);
      std::istream::operator>>(piVar5,&local_3e8);
      local_408 = local_58;
      local_410 = get_pdg_id(in_stack_fffffffffffffa30,
                             (int)((ulong)in_stack_fffffffffffffa28 >> 0x20),
                             (int)in_stack_fffffffffffffa28);
      if (local_410 == 0) {
        pretty_ostream::operator<<
                  (in_stack_fffffffffffff990,(char (*) [7])in_stack_fffffffffffff988);
        pretty_ostream::operator<<(in_stack_fffffffffffff990,(int *)in_stack_fffffffffffff988);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_430,"error",&local_431);
        pretty_ostream::flush((pretty_ostream *)piVar4,type);
        std::__cxx11::string::~string(local_430);
        std::allocator<char>::~allocator((allocator<char> *)&local_431);
        pretty_ostream::operator<<
                  (in_stack_fffffffffffff990,(char (*) [14])in_stack_fffffffffffff988);
        pretty_ostream::operator<<(in_stack_fffffffffffff990,(int *)in_stack_fffffffffffff988);
        pretty_ostream::operator<<
                  (in_stack_fffffffffffff990,(char (*) [11])in_stack_fffffffffffff988);
        pretty_ostream::operator<<(in_stack_fffffffffffff990,(int *)in_stack_fffffffffffff988);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_458,"error",&local_459);
        pretty_ostream::flush((pretty_ostream *)piVar4,type);
        std::__cxx11::string::~string(local_458);
        std::allocator<char>::~allocator((allocator<char> *)&local_459);
        in_stack_fffffffffffffa30 =
             (particleSamples *)
             pretty_ostream::operator<<
                       (in_stack_fffffffffffff990,(char (*) [8])in_stack_fffffffffffff988);
        in_stack_fffffffffffffa28 =
             pretty_ostream::operator<<
                       (in_stack_fffffffffffff990,(double *)in_stack_fffffffffffff988);
        pretty_ostream::operator<<
                  (in_stack_fffffffffffff990,(char (*) [7])in_stack_fffffffffffff988);
        pretty_ostream::operator<<(in_stack_fffffffffffff990,(double *)in_stack_fffffffffffff988);
        pretty_ostream::operator<<
                  (in_stack_fffffffffffff990,(char (*) [8])in_stack_fffffffffffff988);
        pretty_ostream::operator<<(in_stack_fffffffffffff990,(double *)in_stack_fffffffffffff988);
        pretty_ostream::operator<<
                  (in_stack_fffffffffffff990,(char (*) [8])in_stack_fffffffffffff988);
        pretty_ostream::operator<<(in_stack_fffffffffffff990,(double *)in_stack_fffffffffffff988);
        pretty_ostream::operator<<
                  (in_stack_fffffffffffff990,(char (*) [8])in_stack_fffffffffffff988);
        pretty_ostream::operator<<(in_stack_fffffffffffff990,(double *)in_stack_fffffffffffff988);
        pretty_ostream::operator<<
                  (in_stack_fffffffffffff990,(char (*) [7])in_stack_fffffffffffff988);
        pretty_ostream::operator<<(in_stack_fffffffffffff990,(double *)in_stack_fffffffffffff988);
        pretty_ostream::operator<<
                  (in_stack_fffffffffffff990,(char (*) [7])in_stack_fffffffffffff988);
        pretty_ostream::operator<<(in_stack_fffffffffffff990,(double *)in_stack_fffffffffffff988);
        pretty_ostream::operator<<
                  (in_stack_fffffffffffff990,(char (*) [7])in_stack_fffffffffffff988);
        pretty_ostream::operator<<(in_stack_fffffffffffff990,(double *)in_stack_fffffffffffff988);
        pretty_ostream::operator<<
                  (in_stack_fffffffffffff990,(char (*) [7])in_stack_fffffffffffff988);
        pretty_ostream::operator<<(in_stack_fffffffffffff990,(double *)in_stack_fffffffffffff988);
        in_stack_fffffffffffff9a0 =
             (vector<particle_info,_std::allocator<particle_info>_> *)(in_RDI + 0x30);
        paVar6 = &local_481;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_480,"error",paVar6);
        pretty_ostream::flush((pretty_ostream *)piVar4,type);
        std::__cxx11::string::~string(local_480);
        std::allocator<char>::~allocator((allocator<char> *)&local_481);
        pretty_ostream::operator<<(in_stack_fffffffffffff990,in_stack_fffffffffffff988);
        in_stack_fffffffffffff990 = (pretty_ostream *)(in_RDI + 0x30);
        in_stack_fffffffffffff998 = (value_type *)local_4a9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_4a9 + 1),"error",(allocator *)in_stack_fffffffffffff998);
        pretty_ostream::flush((pretty_ostream *)piVar4,type);
        std::__cxx11::string::~string((string *)(local_4a9 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_4a9);
      }
      else {
        std::
        vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
        ::operator[](*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                       **)(in_RDI + 0x698),(long)local_40);
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  (in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
      }
      std::__cxx11::stringstream::~stringstream(local_398);
    }
    local_5c = local_2c + local_5c;
    local_40 = local_40 + 1;
    std::__cxx11::stringstream::~stringstream(local_208);
  }
  std::__cxx11::string::~string(local_28);
  return 0;
}

Assistant:

int particleSamples::read_in_particle_samples_UrQMD_3p3_mixed_event() {
    // clean out the previous record
    clear_out_previous_record(full_particle_list_mixed_event);

    std::string temp_string;
    int n_particle;
    double dummy;
    int parent_proc_type;
    int ievent = 0;
    int urqmd_pid, urqmd_iso3, urqmd_charge;
    double temp_mass;
    int num_particles = 0;
    while (num_particles < event_buffer_size) {
        getline(inputfile_mixed_event, temp_string);

        if (inputfile_mixed_event.eof()) break;

        full_particle_list_mixed_event->push_back(new vector<particle_info>);

        // first skip the header
        for (int i = 0; i < 13; i++)
            getline(inputfile_mixed_event, temp_string);
        // then get number of particles within the event
        getline(inputfile_mixed_event, temp_string);
        std::stringstream temp1(temp_string);
        temp1 >> n_particle;
        // then get one useless line
        getline(inputfile_mixed_event, temp_string);

        for (int ipart = 0; ipart < n_particle; ipart++) {
            getline(inputfile_mixed_event, temp_string);
            std::stringstream temp2(temp_string);
            temp2 >> dummy >> dummy >> dummy >> dummy >> dummy >> dummy >> dummy
                >> dummy >> temp_mass >> urqmd_pid >> urqmd_iso3 >> urqmd_charge
                >> dummy >> dummy >> parent_proc_type;

            particle_info temp_particle_info;
            temp2 >> temp_particle_info.t >> temp_particle_info.x
                >> temp_particle_info.y >> temp_particle_info.z
                >> temp_particle_info.E >> temp_particle_info.px
                >> temp_particle_info.py >> temp_particle_info.pz;
            temp_particle_info.mass = temp_mass;
            temp_particle_info.monval = get_pdg_id(urqmd_pid, urqmd_iso3);
            if (temp_particle_info.monval == 0) {
                messager << "nev = " << ievent;
                messager.flush("error");
                messager << "nparticles = " << n_particle
                         << ", ipart = " << ipart;
                messager.flush("error");
                messager << "mass = " << temp_particle_info.mass
                         << ", E = " << temp_particle_info.E
                         << ", px = " << temp_particle_info.px
                         << ", py = " << temp_particle_info.py
                         << ", pz = " << temp_particle_info.pz
                         << ", t = " << temp_particle_info.t
                         << ", x = " << temp_particle_info.x
                         << ", y = " << temp_particle_info.y
                         << ", z = " << temp_particle_info.z;
                messager.flush("error");
                messager << "Ignore this particle!";
                messager.flush("error");
            } else {
                (*full_particle_list_mixed_event)[ievent]->push_back(
                    temp_particle_info);
            }
        }
        num_particles += n_particle;
        ievent++;
    }
    return (0);
}